

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treeitem.cpp
# Opt level: O3

void __thiscall TreeItem::~TreeItem(TreeItem *this)

{
  TreeItem *pTVar1;
  TreeItem *pTVar2;
  Data *pDVar3;
  Data *pDVar4;
  
  for (pTVar1 = (TreeItem *)
                (this->childItems).super__List_base<TreeItem_*,_std::allocator<TreeItem_*>_>._M_impl
                ._M_node.super__List_node_base._M_next; pTVar1 != this;
      pTVar1 = (TreeItem *)
               (pTVar1->childItems).super__List_base<TreeItem_*,_std::allocator<TreeItem_*>_>.
               _M_impl._M_node.super__List_node_base._M_next) {
    pTVar2 = (TreeItem *)
             (pTVar1->childItems).super__List_base<TreeItem_*,_std::allocator<TreeItem_*>_>._M_impl.
             _M_node._M_size;
    if (pTVar2 != (TreeItem *)0x0) {
      ~TreeItem(pTVar2);
    }
    operator_delete(pTVar2,0xf0);
  }
  pDVar3 = (this->itemUncompressedData).d.d;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->itemUncompressedData).d.d)->super_QArrayData,1,8);
    }
  }
  pDVar3 = (this->itemParsingData).d.d;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->itemParsingData).d.d)->super_QArrayData,1,8);
    }
  }
  pDVar3 = (this->itemTail).d.d;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->itemTail).d.d)->super_QArrayData,1,8);
    }
  }
  pDVar3 = (this->itemBody).d.d;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->itemBody).d.d)->super_QArrayData,1,8);
    }
  }
  pDVar3 = (this->itemHeader).d.d;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->itemHeader).d.d)->super_QArrayData,1,8);
    }
  }
  pDVar4 = (this->itemInfo).d.d;
  if (pDVar4 != (Data *)0x0) {
    LOCK();
    (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->itemInfo).d.d)->super_QArrayData,2,8);
    }
  }
  pDVar4 = (this->itemText).d.d;
  if (pDVar4 != (Data *)0x0) {
    LOCK();
    (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->itemText).d.d)->super_QArrayData,2,8);
    }
  }
  pDVar4 = (this->itemName).d.d;
  if (pDVar4 != (Data *)0x0) {
    LOCK();
    (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->itemName).d.d)->super_QArrayData,2,8);
    }
  }
  pTVar1 = (TreeItem *)
           (this->childItems).super__List_base<TreeItem_*,_std::allocator<TreeItem_*>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  while (pTVar1 != this) {
    pTVar2 = (TreeItem *)
             (pTVar1->childItems).super__List_base<TreeItem_*,_std::allocator<TreeItem_*>_>._M_impl.
             _M_node.super__List_node_base._M_next;
    operator_delete(pTVar1,0x18);
    pTVar1 = pTVar2;
  }
  return;
}

Assistant:

TreeItem::~TreeItem() {
    std::list<TreeItem*>::iterator begin = childItems.begin();
    while (begin != childItems.end()) {
        delete *begin;
        ++begin;
    }
}